

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void pybind11::detail::add_class_method(object *cls,char *name_,cpp_function *cf)

{
  handle obj;
  bool bVar1;
  int iVar2;
  object local_68;
  object *local_60;
  handle local_58;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>> local_50 [8]
  ;
  PyObject *local_48;
  object local_40;
  object local_38;
  
  cpp_function::name((cpp_function *)&local_58);
  obj.m_ptr = (cls->super_handle).m_ptr;
  if (local_58.m_ptr != (PyObject *)0x0) {
    (local_58.m_ptr)->ob_refcnt = (local_58.m_ptr)->ob_refcnt + 1;
  }
  local_40.super_handle.m_ptr = (handle)(handle)local_58.m_ptr;
  local_68.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_60 = cls;
  local_48 = obj.m_ptr;
  object::~object(&local_68);
  accessor_policies::obj_attr::set
            (obj,local_58,(cf->super_function).super_object.super_handle.m_ptr);
  object::~object(&local_38);
  object::~object(&local_40);
  object::~object((object *)&local_58);
  iVar2 = strcmp(name_,"__eq__");
  if (iVar2 == 0) {
    local_48 = (local_60->super_handle).m_ptr;
    local_40.super_handle.m_ptr = (handle)(PyObject *)0x1f873c;
    local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
    bVar1 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
            contains<char_const(&)[9]>(local_50,(char (*) [9])"__hash__");
    object::~object(&local_38);
    if (!bVar1) {
      local_68.super_handle.m_ptr = (handle)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
      local_48 = (local_60->super_handle).m_ptr;
      local_40.super_handle.m_ptr = (handle)(PyObject *)0x1f89a1;
      local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
      accessor_policies::str_attr::set((handle)local_48,"__hash__",(PyObject *)&_Py_NoneStruct);
      object::~object(&local_38);
      object::~object(&local_68);
    }
  }
  return;
}

Assistant:

inline void add_class_method(object& cls, const char *name_, const cpp_function &cf) {
    cls.attr(cf.name()) = cf;
    if (strcmp(name_, "__eq__") == 0 && !cls.attr("__dict__").contains("__hash__")) {
      cls.attr("__hash__") = none();
    }
}